

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_lookup.cc
# Opt level: O0

string * __thiscall
absl::time_internal::cctz::time_zone::name_abi_cxx11_
          (string *__return_storage_ptr__,time_zone *this)

{
  Impl *this_00;
  string *psVar1;
  time_zone *this_local;
  
  this_00 = effective_impl(this);
  psVar1 = Impl::Name_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string time_zone::name() const { return effective_impl().Name(); }